

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msh2osh.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  char **argv_local;
  path local_498 [32];
  CommPtr world;
  int argc_local;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_460;
  Library lib;
  Mesh mesh;
  
  argv_local = argv;
  argc_local = argc;
  Omega_h::Library::Library(&lib,&argc_local,&argv_local);
  if (argc_local == 3) {
    Omega_h::Library::world();
    Omega_h::filesystem::path::path(local_498,argv_local[1]);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_460,&world.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    Omega_h::gmsh::read(&mesh,local_498,&local_460);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_460._M_refcount);
    std::__cxx11::string::~string((string *)local_498);
    Omega_h::filesystem::path::path(local_498,argv_local[2]);
    Omega_h::binary::write(local_498,&mesh);
    std::__cxx11::string::~string((string *)local_498);
    Omega_h::Mesh::~Mesh(&mesh);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&world.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Omega_h::Library::~Library(&lib);
    return 0;
  }
  uVar1 = Omega_h::fail("assertion %s failed at %s +%d\n","argc == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/msh2osh.cpp"
                        ,5);
  std::__cxx11::string::~string((string *)local_498);
  Omega_h::Mesh::~Mesh(&mesh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&world.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Omega_h::Library::~Library(&lib);
  _Unwind_Resume(uVar1);
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  OMEGA_H_CHECK(argc == 3);
  auto world = lib.world();
  auto mesh = Omega_h::gmsh::read(argv[1], world);
  Omega_h::binary::write(argv[2], &mesh);
}